

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::Free(Instr *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *this_00;
  Opnd *pOVar5;
  char *message;
  char *error;
  BranchInstr *branchInstr;
  uint lineNumber;
  
  if (((this->m_kind == InstrKindProfiledLabel) || (this->m_kind == InstrKindLabel)) &&
     (((ulong)this[1].m_func & 4) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x14b,"(!this->IsLabelInstr() || !this->AsLabelInstr()->m_hasNonBranchRef)",
                       "Cannot free label with non-branch reference");
    if (!bVar3) goto LAB_004b9747;
    *puVar4 = 0;
  }
  if (this->m_kind == InstrKindBranch) {
    BranchInstr::ClearTarget((BranchInstr *)this);
  }
  pOVar5 = this->m_dst;
  if (pOVar5 == (Opnd *)0x0) goto LAB_004b9616;
  this_00 = Opnd::GetStackSym(pOVar5);
  if (this_00 != (StackSym *)0x0) {
    uVar1 = *(uint *)&this_00->field_0x18;
    if ((uVar1 & 1) == 0) {
      if ((((uVar1 & 8) != 0) || ((this_00->field_5).m_instrDef != (Instr *)0x0)) &&
         (((uVar1 & 0x40) == 0 || ((this_00->field_5).m_instrDef == (Instr *)0x0)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        error = 
        "((!stackSym->m_isConst && stackSym->constantValue == 0) || (stackSym->m_isEncodedConstant && stackSym->constantValue != 0))"
        ;
        message = 
        "(!stackSym->m_isConst && stackSym->constantValue == 0) || (stackSym->m_isEncodedConstant && stackSym->constantValue != 0)"
        ;
        lineNumber = 0x174;
        goto LAB_004b95ee;
      }
    }
    else {
      if ((uVar1 & 0x40) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x15f,"(!stackSym->m_isEncodedConstant)",
                           "!stackSym->m_isEncodedConstant");
        if (!bVar3) goto LAB_004b9747;
        *puVar4 = 0;
      }
      if ((this_00->field_5).m_instrDef == this) {
        if ((char)pOVar5->field_0xb < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0x162,"(!dstOpnd->isFakeDst)","!dstOpnd->isFakeDst");
          if (!bVar3) goto LAB_004b9747;
          *puVar4 = 0;
        }
        bVar3 = StackSym::IsConst(this_00);
        if (bVar3) {
          return;
        }
        if ((this->m_func->topFunc->allowRemoveBailOutArgInstr == false) &&
           ((this_00->field_0x1b & 1) != 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          error = 
          "(this->m_func->GetTopFunc()->allowRemoveBailOutArgInstr || !stackSym->m_isBailOutReferenced)"
          ;
          message = 
          "this->m_func->GetTopFunc()->allowRemoveBailOutArgInstr || !stackSym->m_isBailOutReferenced"
          ;
          lineNumber = 0x169;
          goto LAB_004b95ee;
        }
      }
      else if (-1 < (char)pOVar5->field_0xb) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        error = "(dstOpnd->isFakeDst)";
        message = "dstOpnd->isFakeDst";
        lineNumber = 0x16d;
LAB_004b95ee:
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,lineNumber,error,message);
        if (!bVar3) {
LAB_004b9747:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
  }
  pOVar5 = UnlinkDst(this);
  Opnd::Free(pOVar5,this->m_func);
LAB_004b9616:
  if (this->m_src1 != (Opnd *)0x0) {
    pOVar5 = UnlinkSrc1(this);
    Opnd::Free(pOVar5,this->m_func);
  }
  if (this->m_src2 != (Opnd *)0x0) {
    pOVar5 = UnlinkSrc2(this);
    Opnd::Free(pOVar5,this->m_func);
  }
  ClearBailOutInfo(this);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             this->m_func->m_alloc,this,0x58);
  return;
}

Assistant:

void
Instr::Free()
{
    AssertMsg(!this->IsLabelInstr() || !this->AsLabelInstr()->m_hasNonBranchRef,
        "Cannot free label with non-branch reference");

    switch (this->GetKind())
    {
    case InstrKindBranch:
        {
            IR::BranchInstr *branchInstr = this->AsBranchInstr();
            branchInstr->ClearTarget();
            break;
        }
    }

    IR::Opnd * dstOpnd = this->GetDst();
    if (dstOpnd)
    {
        StackSym * stackSym = dstOpnd->GetStackSym();
        if (stackSym)
        {
            if (stackSym->m_isSingleDef)
            {
                Assert(!stackSym->m_isEncodedConstant);
                if (stackSym->m_instrDef == this)
                {
                    Assert(!dstOpnd->isFakeDst);
                    if (stackSym->IsConst())
                    {
                        // keep the instruction around so we can get the constant value
                        // from the symbol
                        return;
                    }
                    Assert(this->m_func->GetTopFunc()->allowRemoveBailOutArgInstr || !stackSym->m_isBailOutReferenced);
                }
                else
                {
                    Assert(dstOpnd->isFakeDst);
                }
            }
            else
            {
                // Encoded constants are not single-defs anymore, and therefore not isConst.
                Assert((!stackSym->m_isConst && stackSym->constantValue == 0)
                    || (stackSym->m_isEncodedConstant && stackSym->constantValue != 0));
            }
        }
        this->FreeDst();
    }
    if (this->GetSrc1())
    {
        this->FreeSrc1();
    }
    if (this->GetSrc2())
    {
        // This pattern isn't so unusual:
        //     src = instr->UnlinkSrc1();
        //     instr->Remove();
        this->FreeSrc2();
    }

    ClearBailOutInfo();
    JitAdelete(this->m_func->m_alloc, this);
}